

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

uint __thiscall ON_SubDFace::MarkedVertexCount(ON_SubDFace *this)

{
  bool bVar1;
  ON_SubDVertex *pOVar2;
  ON_SubDVertex *v;
  ON_SubDEdgePtr *pOStack_20;
  unsigned_short fei;
  ON_SubDEdgePtr *eptr;
  uint marked_vertex_count;
  ON_SubDFace *this_local;
  
  eptr._4_4_ = 0;
  pOStack_20 = this->m_edge4;
  v._6_2_ = 0;
  while ((v._6_2_ < this->m_edge_count &&
         ((v._6_2_ != 4 || (pOStack_20 = this->m_edgex, pOStack_20 != (ON_SubDEdgePtr *)0x0))))) {
    pOVar2 = ON_SubDEdgePtr::RelativeVertex(pOStack_20,0);
    if ((pOVar2 != (ON_SubDVertex *)0x0) &&
       (bVar1 = ON_ComponentStatus::RuntimeMark(&(pOVar2->super_ON_SubDComponentBase).m_status),
       bVar1)) {
      eptr._4_4_ = eptr._4_4_ + 1;
    }
    v._6_2_ = v._6_2_ + 1;
    pOStack_20 = pOStack_20 + 1;
  }
  return eptr._4_4_;
}

Assistant:

unsigned int ON_SubDFace::MarkedVertexCount() const
{
  unsigned int marked_vertex_count = 0;
  const ON_SubDEdgePtr* eptr = m_edge4;
  for (unsigned short fei = 0; fei < m_edge_count; ++fei, ++ eptr)
  {
    if (4 == fei)
    {
      eptr = m_edgex;
      if (nullptr == eptr)
        break;
    }
    const ON_SubDVertex* v = eptr->RelativeVertex(0);
    if (nullptr != v && v->m_status.RuntimeMark())
      ++marked_vertex_count;
  }
  return marked_vertex_count;
}